

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AuxiliaryMethods.cpp
# Opt level: O3

GraphDatabase *
AuxiliaryMethods::read_graph_txt_file(GraphDatabase *__return_storage_ptr__,string *data_set_name)

{
  pointer *ppiVar1;
  pointer *ppvVar2;
  _Alloc_hider __nptr;
  string *psVar3;
  char cVar4;
  char cVar5;
  uint uVar6;
  long *plVar7;
  istream *piVar8;
  int *piVar9;
  long lVar10;
  undefined8 *puVar11;
  __node_base *p_Var12;
  pointer puVar13;
  uint *puVar14;
  long *plVar15;
  size_type *psVar16;
  int iVar17;
  Node w;
  ulong uVar18;
  long lVar19;
  Node v;
  long lVar20;
  bool bVar21;
  string line;
  Labels l;
  GraphDatabase *graph_database;
  EdgeList edge_list;
  vector<unsigned_int,_std::allocator<unsigned_int>_> graph_indicator;
  string label;
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  offset;
  Labels node_labels;
  pair<int,_int> p;
  vector<int,_std::allocator<int>_> edges;
  ifstream edge_file;
  ifstream labels;
  ifstream myfile;
  long *local_7d8;
  long local_7d0;
  undefined1 local_7c8 [16];
  vector<int,_std::allocator<int>_> local_7b8;
  undefined8 uStack_7a0;
  GraphDatabase *local_798;
  uint local_78c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_788;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_768;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_750;
  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_730;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_6f8;
  string *local_6e0;
  undefined8 local_6d8;
  long local_6d0;
  long local_6c8;
  long lStack_6c0;
  vector<int,_std::allocator<int>_> local_6b8;
  string local_6a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_680;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_660;
  Graph local_648 [8];
  long *local_440;
  long local_438;
  long local_430;
  long lStack_428;
  long local_238 [65];
  
  local_7d8 = (long *)local_7c8;
  local_7d0 = 0;
  local_7c8[0] = 0;
  local_768.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_768.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (uint *)0x0;
  local_768.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_798 = __return_storage_ptr__;
  std::operator+(&local_750,"/home/morris/amenability_test/data_sets/",data_set_name);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_750);
  plVar15 = plVar7 + 2;
  if ((__node_base *)*plVar7 == (__node_base *)plVar15) {
    local_730._M_before_begin._M_nxt = (_Hash_node_base *)*plVar15;
    local_730._M_element_count = plVar7[3];
    local_730._M_buckets = &local_730._M_before_begin._M_nxt;
  }
  else {
    local_730._M_before_begin._M_nxt = (_Hash_node_base *)*plVar15;
    local_730._M_buckets = (__buckets_ptr)*plVar7;
  }
  local_730._M_bucket_count = plVar7[1];
  *plVar7 = (long)plVar15;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_730,(ulong)(data_set_name->_M_dataplus)._M_p);
  local_648[0].m_adjacency_lists.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_648[0].m_adjacency_lists.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  plVar15 = plVar7 + 2;
  if ((pointer *)*plVar7 == (pointer *)plVar15) {
    local_648[0].m_adjacency_lists.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*plVar15;
    local_648[0].m_num_nodes = plVar7[3];
  }
  else {
    local_648[0].m_adjacency_lists.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*plVar15;
    local_648[0].m_adjacency_lists.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar7;
  }
  local_648[0].m_adjacency_lists.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar7[1];
  *plVar7 = (long)plVar15;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)local_648);
  plVar15 = plVar7 + 2;
  if ((long *)*plVar7 == plVar15) {
    local_430 = *plVar15;
    lStack_428 = plVar7[3];
    local_440 = &local_430;
  }
  else {
    local_430 = *plVar15;
    local_440 = (long *)*plVar7;
  }
  local_438 = plVar7[1];
  *plVar7 = (long)plVar15;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_6e0 = data_set_name;
  std::ifstream::ifstream((istream *)local_238,(string *)&local_440,_S_in);
  if (local_440 != &local_430) {
    operator_delete(local_440);
  }
  if (local_648[0].m_adjacency_lists.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)&local_648[0].m_adjacency_lists.
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(local_648[0].m_adjacency_lists.
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((__node_base *)local_730._M_buckets != &local_730._M_before_begin) {
    operator_delete(local_730._M_buckets);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_750._M_dataplus._M_p != &local_750.field_2) {
    operator_delete(local_750._M_dataplus._M_p);
  }
  cVar4 = std::__basic_file<char>::is_open();
  if (cVar4 != '\0') {
    while( true ) {
      cVar4 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                              (char)(istream *)local_238);
      piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_238,(string *)&local_7d8,cVar4);
      plVar7 = local_7d8;
      if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) != 0) break;
      piVar9 = __errno_location();
      iVar17 = *piVar9;
      *piVar9 = 0;
      lVar10 = strtol((char *)plVar7,(char **)&local_440,10);
      if (local_440 == plVar7) {
        std::__throw_invalid_argument("stoi");
LAB_0010904e:
        std::__throw_out_of_range("stoi");
        goto LAB_0010905a;
      }
      if ((lVar10 - 0x80000000U < 0xffffffff00000000) || (*piVar9 == 0x22)) goto LAB_0010904e;
      if (*piVar9 == 0) {
        *piVar9 = iVar17;
      }
      uVar6 = (int)lVar10 - 1;
      local_648[0].m_adjacency_lists.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_648[0].m_adjacency_lists.
                             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,uVar6);
      if (local_768.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_768.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (&local_768,
                   (iterator)
                   local_768.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish,(uint *)local_648);
      }
      else {
        *local_768.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish = uVar6;
        local_768.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_768.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
    }
    std::ifstream::close();
    psVar3 = local_6e0;
    local_78c = local_768.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish[-1];
    local_750._M_dataplus._M_p = (pointer)&local_750.field_2;
    local_750._M_string_length = 0;
    local_750.field_2._M_local_buf[0] = '\0';
    local_6f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
    local_6f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_6f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
    std::operator+(&local_788,"/home/morris/amenability_test/data_sets/",local_6e0);
    ppvVar2 = &local_648[0].m_adjacency_lists.
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_788);
    local_7b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)&local_7b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
    piVar9 = (int *)(puVar11 + 2);
    if ((pointer *)*puVar11 == (pointer *)piVar9) {
      local_7b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = *(pointer *)piVar9;
      uStack_7a0 = puVar11[3];
    }
    else {
      local_7b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = *(pointer *)piVar9;
      local_7b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)*puVar11;
    }
    local_7b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)puVar11[1];
    *puVar11 = piVar9;
    puVar11[1] = 0;
    *(undefined1 *)(puVar11 + 2) = 0;
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_7b8,(ulong)(psVar3->_M_dataplus)._M_p);
    plVar7 = puVar11 + 2;
    if ((__node_base *)*puVar11 == (__node_base *)plVar7) {
      local_730._M_before_begin._M_nxt = (_Hash_node_base *)*plVar7;
      local_730._M_element_count = puVar11[3];
      local_730._M_buckets = &local_730._M_before_begin._M_nxt;
    }
    else {
      local_730._M_before_begin._M_nxt = (_Hash_node_base *)*plVar7;
      local_730._M_buckets = (__buckets_ptr)*puVar11;
    }
    local_730._M_bucket_count = puVar11[1];
    *puVar11 = plVar7;
    puVar11[1] = 0;
    *(undefined1 *)(puVar11 + 2) = 0;
    puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_730);
    plVar7 = puVar11 + 2;
    if ((pointer *)*puVar11 == (pointer *)plVar7) {
      local_648[0].m_adjacency_lists.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*plVar7;
      local_648[0].m_num_nodes = puVar11[3];
      local_648[0].m_adjacency_lists.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)ppvVar2;
    }
    else {
      local_648[0].m_adjacency_lists.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*plVar7;
      local_648[0].m_adjacency_lists.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)*puVar11;
    }
    local_648[0].m_adjacency_lists.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)puVar11[1];
    *puVar11 = plVar7;
    puVar11[1] = 0;
    *(undefined1 *)(puVar11 + 2) = 0;
    std::ifstream::ifstream((istream *)&local_440,(string *)local_648,_S_in);
    if (local_648[0].m_adjacency_lists.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppvVar2) {
      operator_delete(local_648[0].m_adjacency_lists.
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((__node_base *)local_730._M_buckets != &local_730._M_before_begin) {
      operator_delete(local_730._M_buckets);
    }
    if ((pointer *)
        local_7b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        &local_7b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage) {
      operator_delete(local_7b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_788._M_dataplus._M_p != &local_788.field_2) {
      operator_delete(local_788._M_dataplus._M_p);
    }
    cVar4 = std::__basic_file<char>::is_open();
    if (cVar4 != '\0') {
      while( true ) {
        cVar5 = std::ios::widen((char)local_440[-3] + (char)(istream *)&local_440);
        piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)&local_440,(string *)&local_750,cVar5);
        __nptr._M_p = local_750._M_dataplus._M_p;
        if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) != 0) break;
        piVar9 = __errno_location();
        iVar17 = *piVar9;
        *piVar9 = 0;
        p_Var12 = (__node_base *)strtoul(__nptr._M_p,(char **)local_648,10);
        if (local_648[0].m_adjacency_lists.
            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == (pointer)__nptr._M_p) goto LAB_00109072;
        if (*piVar9 == 0) {
          *piVar9 = iVar17;
        }
        else if (*piVar9 == 0x22) goto LAB_0010907e;
        local_730._M_buckets = (__buckets_ptr)p_Var12;
        if (local_6f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_6f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>
                    (&local_6f8,
                     (iterator)
                     local_6f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_730);
        }
        else {
          *local_6f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish = (unsigned_long)p_Var12;
          local_6f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_6f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
      std::ifstream::close();
    }
    (local_798->super__Vector_base<GraphLibrary::Graph,_std::allocator<GraphLibrary::Graph>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_798->super__Vector_base<GraphLibrary::Graph,_std::allocator<GraphLibrary::Graph>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_798->super__Vector_base<GraphLibrary::Graph,_std::allocator<GraphLibrary::Graph>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_730._M_buckets = &local_730._M_single_bucket;
    local_730._M_bucket_count = 1;
    local_730._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_730._M_element_count = 0;
    local_730._M_rehash_policy._M_max_load_factor = 1.0;
    local_730._M_rehash_policy._M_next_resize = 0;
    local_730._M_single_bucket = (__node_base_ptr)0x0;
    if (local_78c != 0xffffffff) {
      iVar17 = 0;
      uVar6 = 0;
      do {
        local_6d8 = (long *)CONCAT44(iVar17,uVar6);
        std::
        _Hashtable<int,std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<std::pair<int,int>&>
                  ((_Hashtable<int,std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)&local_730,&local_6d8);
        lVar10 = 0;
        for (puVar13 = local_768.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start;
            puVar13 !=
            local_768.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish; puVar13 = puVar13 + 1) {
          lVar10 = lVar10 + (ulong)(*puVar13 == uVar6);
        }
        local_7b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_7b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_7b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        if ((cVar4 != '\0') && (uVar18 = (ulong)iVar17, uVar18 < lVar10 + uVar18)) {
          lVar19 = uVar18 << 3;
          lVar20 = lVar10;
          do {
            if (local_7b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_7b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_long,std::allocator<unsigned_long>>::
              _M_realloc_insert<unsigned_long_const&>
                        ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_7b8,
                         (iterator)
                         local_7b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,
                         (unsigned_long *)
                         ((long)local_6f8.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar19));
            }
            else {
              *(unsigned_long *)
               local_7b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish =
                   *(unsigned_long *)
                    ((long)local_6f8.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start + lVar19);
              local_7b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   (pointer)((long)local_7b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish + 8);
            }
            lVar19 = lVar19 + 8;
            lVar20 = lVar20 + -1;
          } while (lVar20 != 0);
        }
        local_788._M_dataplus._M_p = (pointer)0x0;
        local_788._M_string_length = 0;
        local_788.field_2._M_allocated_capacity = 0;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  (&local_660,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_7b8);
        GraphLibrary::Graph::Graph(local_648,(uint)lVar10,(EdgeList *)&local_788,&local_660);
        if (local_660.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_660.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        std::vector<GraphLibrary::Graph,_std::allocator<GraphLibrary::Graph>_>::push_back
                  (local_798,local_648);
        GraphLibrary::Graph::~Graph(local_648);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_788._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_788._M_dataplus._M_p);
        }
        if ((pointer *)
            local_7b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer *)0x0) {
          operator_delete(local_7b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        iVar17 = iVar17 + (uint)lVar10;
        bVar21 = uVar6 != local_78c;
        uVar6 = uVar6 + 1;
      } while (bVar21);
    }
    psVar3 = local_6e0;
    local_6b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_6b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (int *)0x0;
    local_6b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (int *)0x0;
    std::operator+(&local_680,"/home/morris/amenability_test/data_sets/",local_6e0);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_680);
    plVar15 = plVar7 + 2;
    if ((long *)*plVar7 == plVar15) {
      local_6c8 = *plVar15;
      lStack_6c0 = plVar7[3];
      local_6d8 = &local_6c8;
    }
    else {
      local_6c8 = *plVar15;
      local_6d8 = (long *)*plVar7;
    }
    local_6d0 = plVar7[1];
    *plVar7 = (long)plVar15;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_6d8,(ulong)(psVar3->_M_dataplus)._M_p);
    local_788._M_dataplus._M_p = (pointer)&local_788.field_2;
    psVar16 = (size_type *)(plVar7 + 2);
    ppiVar1 = &local_7b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_788.field_2._M_allocated_capacity = *psVar16;
      local_788.field_2._8_8_ = plVar7[3];
    }
    else {
      local_788.field_2._M_allocated_capacity = *psVar16;
      local_788._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_788._M_string_length = plVar7[1];
    *plVar7 = (long)psVar16;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_788);
    piVar9 = (int *)(puVar11 + 2);
    if ((pointer *)*puVar11 == (pointer *)piVar9) {
      local_7b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = *(pointer *)piVar9;
      uStack_7a0 = puVar11[3];
      local_7b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)ppiVar1;
    }
    else {
      local_7b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = *(pointer *)piVar9;
      local_7b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)*puVar11;
    }
    local_7b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)puVar11[1];
    *puVar11 = piVar9;
    puVar11[1] = 0;
    *(undefined1 *)(puVar11 + 2) = 0;
    std::ifstream::ifstream(local_648,(string *)&local_7b8,_S_in);
    if ((pointer *)
        local_7b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != ppiVar1) {
      operator_delete(local_7b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_788._M_dataplus._M_p != &local_788.field_2) {
      operator_delete(local_788._M_dataplus._M_p);
    }
    if (local_6d8 != &local_6c8) {
      operator_delete(local_6d8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_680._M_dataplus._M_p != &local_680.field_2) {
      operator_delete(local_680._M_dataplus._M_p);
    }
    cVar4 = std::__basic_file<char>::is_open();
    if (cVar4 != '\0') {
      while( true ) {
        cVar4 = std::ios::widen((char)*(long *)((long)local_648[0].m_adjacency_lists.
                                                                                                            
                                                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + -0x18)
                                + (char)local_648);
        piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)local_648,(string *)&local_7d8,cVar4);
        if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) != 0) {
          std::ifstream::close();
          std::ifstream::~ifstream(local_648);
          if (local_6b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_6b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          std::
          _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::~_Hashtable(&local_730);
          std::ifstream::~ifstream(&local_440);
          if (local_6f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_6f8.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_750._M_dataplus._M_p != &local_750.field_2) {
            operator_delete(local_750._M_dataplus._M_p);
          }
          std::ifstream::~ifstream(local_238);
          if (local_768.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (uint *)0x0) {
            operator_delete(local_768.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_7d8 != (long *)local_7c8) {
            operator_delete(local_7d8);
          }
          return local_798;
        }
        local_6a0._M_dataplus._M_p = (pointer)&local_6a0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_6a0,local_7d8,(undefined1 *)((long)local_7d8 + local_7d0));
        split_string(&local_7b8,&local_6a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
          operator_delete(local_6a0._M_dataplus._M_p);
        }
        uVar6 = local_768.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start
                [(long)*local_7b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start + -1];
        local_788._M_dataplus._M_p._0_4_ = uVar6;
        puVar14 = (uint *)std::__detail::
                          _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          ::operator[]((_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                        *)&local_730,(key_type *)&local_788);
        v = *local_7b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start + ~*puVar14;
        w = ~*puVar14 +
            *(int *)((long)local_7b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start + 4);
        bVar21 = GraphLibrary::Graph::has_edge
                           ((local_798->
                            super__Vector_base<GraphLibrary::Graph,_std::allocator<GraphLibrary::Graph>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar6,v,w);
        if (!bVar21) {
          GraphLibrary::Graph::add_edge
                    ((local_798->
                     super__Vector_base<GraphLibrary::Graph,_std::allocator<GraphLibrary::Graph>_>).
                     _M_impl.super__Vector_impl_data._M_start + uVar6,v,w);
        }
        plVar7 = local_7d8;
        piVar9 = __errno_location();
        iVar17 = *piVar9;
        *piVar9 = 0;
        lVar10 = strtol((char *)plVar7,(char **)&local_788,10);
        if ((long *)local_788._M_dataplus._M_p == plVar7) break;
        if ((lVar10 - 0x80000000U < 0xffffffff00000000) || (*piVar9 == 0x22)) goto LAB_00109066;
        if (*piVar9 == 0) {
          *piVar9 = iVar17;
        }
        local_6d8 = (long *)CONCAT44(local_6d8._4_4_,(int)lVar10);
        if (local_6b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_6b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&local_6b8,
                     (iterator)
                     local_6b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(int *)&local_6d8);
        }
        else {
          *local_6b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = (int)lVar10;
          local_6b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_6b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        if ((pointer *)
            local_7b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer *)0x0) {
          operator_delete(local_7b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      }
LAB_0010905a:
      std::__throw_invalid_argument("stoi");
LAB_00109066:
      std::__throw_out_of_range("stoi");
LAB_00109072:
      std::__throw_invalid_argument("stoul");
LAB_0010907e:
      std::__throw_out_of_range("stoul");
    }
  }
  puts("!!! Unable to open file !!!");
  exit(1);
}

Assistant:

GraphDatabase read_graph_txt_file(const string data_set_name) {
        string line;
        vector<uint> graph_indicator;
        ifstream myfile(
                "/home/morris/amenability_test/data_sets/" + data_set_name + "/" + data_set_name +
                "_graph_indicator.txt");
        if (myfile.is_open()) {
            while (getline(myfile, line)) {
                graph_indicator.push_back(stoi(line) - 1);
            }
            myfile.close();
        } else {
            printf("%s", "!!! Unable to open file !!!\n");
            exit(EXIT_FAILURE);
        }

        uint num_graphs = graph_indicator.back() + 1;

        // Get labels from for each node.
        bool label_data = true;
        string label;
        Labels node_labels;
        ifstream labels(
                "/home/morris/amenability_test/data_sets/" + data_set_name + "/" + data_set_name + "_node_labels.txt");
        if (labels.is_open()) {
            while (getline(labels, label)) {
                node_labels.push_back(stoul(label));
            }
            myfile.close();
        } else {
            label_data = false;
        }

        GraphDatabase graph_database;
        unordered_map<int, int> offset;
        int num_nodes = 0;

        // Add vertices to each graph in graph database and assign labels.
        for (uint i = 0; i < num_graphs; ++i) {
            pair<int, int> p(i, num_nodes);
            offset.insert(p);
            unsigned long s = count(graph_indicator.begin(), graph_indicator.end(), i);

            Labels l;
            if (label_data) {
                for (unsigned long j = num_nodes; j < s + num_nodes; ++j) {
                    l.push_back(node_labels[j]);
                }
            }

            num_nodes += s;
            EdgeList edge_list;

            Graph new_graph(s, edge_list, l);
            graph_database.push_back(new_graph);
        }

        // Insert edges for each graph.
        vector<int> edges;
        ifstream edge_file(
                "/home/morris/amenability_test/data_sets/" + data_set_name + "/" + data_set_name + "_A.txt");
        if (edge_file.is_open()) {
            while (getline(edge_file, line)) {
                vector<int> r = split_string(line);

                uint graph_num = graph_indicator[r[0] - 1];
                uint off = offset[graph_num];
                Node v = r[0] - 1 - off;
                Node w = r[1] - 1 - off;

                if (!graph_database[graph_num].has_edge(v, w)) {
                    graph_database[graph_num].add_edge(v, w);
                }
                edges.push_back(stoi(line));
            }
            edge_file.close();
        } else {
            printf("%s", "!!! Unable to open file !!!\n");
            exit(EXIT_FAILURE);
        }

        return graph_database;
    }